

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O3

void acutest_dump_(char *title,void *addr,size_t size)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  char *__format;
  uint __c;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  
  if (((1 < acutest_verbose_level_) && (acutest_current_test_ != (acutest_test_ *)0x0)) &&
     (acutest_cond_failed_ != 0)) {
    sVar8 = 0x400;
    uVar2 = size - 0x400;
    if (size < 0x400) {
      sVar8 = size;
      uVar2 = 0;
    }
    acutest_line_indent_(3 - (uint)(acutest_case_name_[0] == '\0'));
    sVar3 = strlen(title);
    __format = "%s:\n";
    if (title[sVar3 - 1] == ':') {
      __format = "%s\n";
    }
    printf(__format,title);
    if (size != 0) {
      uVar4 = 0;
      do {
        acutest_line_indent_(4 - (uint)(acutest_case_name_[0] == '\0'));
        printf("%08lx: ",uVar4);
        lVar6 = 0x10;
        uVar7 = uVar4;
        do {
          if (uVar7 < sVar8) {
            printf(" %02x",(ulong)*(byte *)((long)addr + uVar7));
          }
          else {
            printf("   ");
          }
          uVar7 = uVar7 + 1;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
        uVar7 = uVar4 + 0x10;
        printf("  ");
        uVar5 = sVar8;
        if (uVar7 < sVar8) {
          uVar5 = uVar7;
        }
        if (uVar4 < sVar8) {
          do {
            __c = (uint)*(byte *)((long)addr + uVar4);
            iVar1 = iscntrl((uint)*(byte *)((long)addr + uVar4));
            if (iVar1 != 0) {
              __c = 0x2e;
            }
            putchar(__c);
            uVar4 = uVar4 + 1;
          } while (uVar4 < uVar5);
        }
        putchar(10);
        uVar4 = uVar7;
      } while (uVar7 < sVar8);
      if (0x400 < size) {
        acutest_line_indent_(4 - (uint)(acutest_case_name_[0] == '\0'));
        printf("           ... (and more %u bytes)\n",uVar2 & 0xffffffff);
        return;
      }
    }
  }
  return;
}

Assistant:

void
acutest_dump_(const char* title, const void* addr, size_t size)
{
    static const size_t BYTES_PER_LINE = 16;
    size_t line_beg;
    size_t truncate = 0;

    if(acutest_verbose_level_ < 2)
        return;

    /* We allow extra message only when something is already wrong in the
     * current test. */
    if(acutest_current_test_ == NULL  ||  !acutest_cond_failed_)
        return;

    if(size > TEST_DUMP_MAXSIZE) {
        truncate = size - TEST_DUMP_MAXSIZE;
        size = TEST_DUMP_MAXSIZE;
    }

    acutest_line_indent_(acutest_case_name_[0] ? 3 : 2);
    printf((title[strlen(title)-1] == ':') ? "%s\n" : "%s:\n", title);

    for(line_beg = 0; line_beg < size; line_beg += BYTES_PER_LINE) {
        size_t line_end = line_beg + BYTES_PER_LINE;
        size_t off;

        acutest_line_indent_(acutest_case_name_[0] ? 4 : 3);
        printf("%08lx: ", (unsigned long)line_beg);
        for(off = line_beg; off < line_end; off++) {
            if(off < size)
                printf(" %02x", ((const unsigned char*)addr)[off]);
            else
                printf("   ");
        }

        printf("  ");
        for(off = line_beg; off < line_end; off++) {
            unsigned char byte = ((const unsigned char*)addr)[off];
            if(off < size)
                printf("%c", (iscntrl(byte) ? '.' : byte));
            else
                break;
        }

        printf("\n");
    }

    if(truncate > 0) {
        acutest_line_indent_(acutest_case_name_[0] ? 4 : 3);
        printf("           ... (and more %u bytes)\n", (unsigned) truncate);
    }
}